

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O1

void __thiscall btBU_Simplex1to4::getEdge(btBU_Simplex1to4 *this,int i,btVector3 *pa,btVector3 *pb)

{
  int iVar1;
  undefined8 uVar2;
  btVector3 *pbVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  
  iVar1 = *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74;
  if (iVar1 == 4) {
    switch(i) {
    case 0:
      goto switchD_0016e0d6_caseD_0;
    case 1:
switchD_0016e0d6_caseD_1:
      uVar2 = *(undefined8 *)(this->m_vertices[1].m_floats + 2);
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[1].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = uVar2;
      pbVar3 = this->m_vertices + 2;
      goto LAB_0016e11b;
    case 2:
switchD_0016e0d6_caseD_2:
      uVar2 = *(undefined8 *)(this->m_vertices[2].m_floats + 2);
      pbVar3 = this->m_vertices;
      *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[2].m_floats;
      *(undefined8 *)(pa->m_floats + 2) = uVar2;
      goto LAB_0016e11b;
    case 3:
      bVar4 = this->m_vertices[0].m_floats[0];
      bVar5 = this->m_vertices[0].m_floats[1];
      bVar6 = this->m_vertices[0].m_floats[2];
      bVar7 = this->m_vertices[0].m_floats[3];
      break;
    case 4:
      bVar4 = this->m_vertices[1].m_floats[0];
      bVar5 = this->m_vertices[1].m_floats[1];
      bVar6 = this->m_vertices[1].m_floats[2];
      bVar7 = this->m_vertices[1].m_floats[3];
      break;
    case 5:
      bVar4 = this->m_vertices[2].m_floats[0];
      bVar5 = this->m_vertices[2].m_floats[1];
      bVar6 = this->m_vertices[2].m_floats[2];
      bVar7 = this->m_vertices[2].m_floats[3];
      break;
    default:
      return;
    }
    pa->m_floats[0] = bVar4;
    pa->m_floats[1] = bVar5;
    pa->m_floats[2] = bVar6;
    pa->m_floats[3] = bVar7;
    pbVar3 = this->m_vertices + 3;
  }
  else {
    if (iVar1 == 3) {
      if (i == 2) goto switchD_0016e0d6_caseD_2;
      if (i == 1) goto switchD_0016e0d6_caseD_1;
      if (i != 0) {
        return;
      }
    }
    else if (iVar1 != 2) {
      return;
    }
switchD_0016e0d6_caseD_0:
    uVar2 = *(undefined8 *)(this->m_vertices[0].m_floats + 2);
    *(undefined8 *)pa->m_floats = *(undefined8 *)this->m_vertices[0].m_floats;
    *(undefined8 *)(pa->m_floats + 2) = uVar2;
    pbVar3 = this->m_vertices + 1;
  }
LAB_0016e11b:
  uVar2 = *(undefined8 *)(pbVar3->m_floats + 2);
  *(undefined8 *)pb->m_floats = *(undefined8 *)pbVar3->m_floats;
  *(undefined8 *)(pb->m_floats + 2) = uVar2;
  return;
}

Assistant:

void btBU_Simplex1to4::getEdge(int i,btVector3& pa,btVector3& pb) const
{
	
    switch (m_numVertices)
	{

	case 2: 
		pa = m_vertices[0];
		pb = m_vertices[1];
		break;
	case 3:  
		switch (i)
		{
		case 0:
			pa = m_vertices[0];
			pb = m_vertices[1];
			break;
		case 1:
			pa = m_vertices[1];
			pb = m_vertices[2];
			break;
		case 2:
			pa = m_vertices[2];
			pb = m_vertices[0];
			break;

		}
		break;
	case 4: 
		switch (i)
		{
		case 0:
			pa = m_vertices[0];
			pb = m_vertices[1];
			break;
		case 1:
			pa = m_vertices[1];
			pb = m_vertices[2];
			break;
		case 2:
			pa = m_vertices[2];
			pb = m_vertices[0];
			break;
		case 3:
			pa = m_vertices[0];
			pb = m_vertices[3];
			break;
		case 4:
			pa = m_vertices[1];
			pb = m_vertices[3];
			break;
		case 5:
			pa = m_vertices[2];
			pb = m_vertices[3];
			break;
		}

	}




}